

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pure.cpp
# Opt level: O3

size_type fs_strncpy(char *path,char *result,size_type buffer_size)

{
  size_t sVar1;
  string_view path_00;
  string_view fname;
  error_code local_30;
  
  sVar1 = strlen(path);
  if (sVar1 < buffer_size) {
    if (sVar1 != 0) {
      strncpy(result,path,buffer_size);
      return sVar1;
    }
  }
  else {
    sVar1 = strlen(path);
    local_30._M_cat = (error_category *)std::_V2::generic_category();
    local_30._M_value = 0x22;
    path_00._M_str = path;
    path_00._M_len = sVar1;
    fname._M_str = "fs_strncpy";
    fname._M_len = 10;
    fs_print_error(path_00,fname,&local_30);
  }
  return 0;
}

Assistant:

std::string::size_type fs_strncpy(const char* path, char* result, const std::string::size_type buffer_size)
{
// check size before copy
  std::string::size_type L = std::strlen(path);
  if(L >= buffer_size){
    fs_print_error(path, __func__, std::make_error_code(std::errc::result_out_of_range));
    return 0;
  }

  if(L)
    #ifdef _MSC_VER
      strncpy_s(result, buffer_size, path, _TRUNCATE);
    #else
      std::strncpy(result, path, buffer_size);
    #endif

  return L;
}